

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqliteDeleteColumnNames(sqlite3 *db,Table *pTable)

{
  int iVar1;
  Column *p;
  
  p = pTable->aCol;
  if (p != (Column *)0x0) {
    if (0 < pTable->nCol) {
      iVar1 = 0;
      do {
        sqlite3DbFree(db,p->zName);
        sqlite3ExprDelete(db,p->pDflt);
        sqlite3DbFree(db,p->zDflt);
        sqlite3DbFree(db,p->zType);
        sqlite3DbFree(db,p->zColl);
        iVar1 = iVar1 + 1;
        p = p + 1;
      } while (iVar1 < pTable->nCol);
      p = pTable->aCol;
    }
    sqlite3DbFree(db,p);
    return;
  }
  return;
}

Assistant:

static void sqliteDeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zDflt);
      sqlite3DbFree(db, pCol->zType);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}